

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.h
# Opt level: O0

void __thiscall despot::Config::Config(Config *this)

{
  allocator<char> local_11;
  Config *local_10;
  Config *this_local;
  
  this->time_per_move = 1.0;
  this->sim_len = 0x5a;
  this->num_scenarios = 500;
  this->search_depth = 0x5a;
  this->max_policy_sim_len = 0x5a;
  this->discount = 0.95;
  this->pruning_constant = 0.0;
  this->xi = 0.95;
  this->root_seed = 0x2a;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->default_action,"",&local_11);
  std::allocator<char>::~allocator(&local_11);
  this->noise = 0.1;
  this->silence = false;
  return;
}

Assistant:

Config() :
		time_per_move(1),
		sim_len(90),
		num_scenarios(500),
		search_depth(90),
		max_policy_sim_len(90),
		discount(0.95),
		pruning_constant(0),
		xi(0.95),
		root_seed(42),
		default_action(""),
		noise(0.1),
		silence(false) {
	}